

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

void __thiscall
google::protobuf::EncodedDescriptorDatabase::EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_006819d0;
  p_Var1 = &(this->index_).by_name_._M_t._M_impl.super__Rb_tree_header;
  (this->index_).by_name_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->index_).by_name_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->index_).by_name_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->index_).by_name_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->index_).by_name_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->index_).by_symbol_._M_t._M_impl.super__Rb_tree_header;
  (this->index_).by_symbol_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->index_).by_symbol_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->index_).by_symbol_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->index_).by_symbol_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->index_).by_symbol_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->index_).by_extension_._M_t._M_impl.super__Rb_tree_header;
  (this->index_).by_extension_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->index_).by_extension_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->index_).by_extension_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->index_).by_extension_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->index_).by_extension_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

EncodedDescriptorDatabase::EncodedDescriptorDatabase() {}